

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

int __thiscall
HashMap<String,_(anonymous_namespace)::AddrInfo>::remove
          (HashMap<String,_(anonymous_namespace)::AddrInfo> *this,char *__filename)

{
  usize uVar1;
  long lVar2;
  long *plVar3;
  
  uVar1 = (this->endItem).key._data.capacity;
  *(usize *)(this->endItem).key._data.len = uVar1;
  if (uVar1 != 0) {
    *(usize *)(uVar1 + 0x38) = (this->endItem).key._data.len;
  }
  uVar1 = (this->endItem).key._data.ref;
  lVar2 = *(long *)&(this->endItem).value;
  plVar3 = &DAT_00125750;
  if (uVar1 != 0) {
    plVar3 = (long *)(uVar1 + 0x50);
  }
  *plVar3 = lVar2;
  *(usize *)(lVar2 + 0x48) = uVar1;
  _DAT_00125758 = _DAT_00125758 + -1;
  String::~String((String *)this);
  uVar1 = (usize)DAT_001257c8;
  (this->endItem).key._data.ref = (usize)DAT_001257c8;
  DAT_001257c8 = this;
  return (int)uVar1;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;

    if((*item->cell = item->nextCell))
      item->nextCell->cell = item->cell;

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;

    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }